

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_client_close(archive_write_filter *f)

{
  archive *paVar1;
  long *__ptr;
  archive_vtable_conflict *__s;
  size_t __n;
  long lVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  
  paVar1 = f->archive;
  __ptr = (long *)f->data;
  pvVar5 = (void *)__ptr[2];
  if ((void *)__ptr[3] == pvVar5) {
    iVar3 = 0;
  }
  else {
    lVar2 = *__ptr - __ptr[1];
    lVar6 = (long)*(int *)((long)&paVar1[1].error_string.length + 4);
    if (lVar6 < 1) {
      lVar4 = (long)(int)paVar1[1].error_string.length;
      lVar6 = lVar4;
    }
    else {
      lVar4 = lVar2 + lVar6 + -1;
      lVar4 = lVar4 - lVar4 % lVar6;
      lVar6 = (long)(int)paVar1[1].error_string.length;
    }
    if (lVar4 < lVar6) {
      lVar6 = lVar4;
    }
    if (lVar6 - lVar2 != 0 && lVar2 <= lVar6) {
      memset((void *)__ptr[3],0,lVar6 - lVar2);
      pvVar5 = (void *)__ptr[2];
    }
    lVar2 = (**(code **)&paVar1[1].file_count)(paVar1,paVar1[1].error_string.s,pvVar5);
    iVar3 = -0x1e;
    if (0 < lVar2) {
      iVar3 = 0;
    }
  }
  if ((code *)paVar1[1].error != (code *)0x0) {
    (*(code *)paVar1[1].error)(paVar1);
  }
  free((void *)__ptr[2]);
  free(__ptr);
  f->close = (_func_int_archive_write_filter_ptr *)0x0;
  paVar1[1].error_string.s = (char *)0x0;
  __s = paVar1[2].vtable;
  if (__s != (archive_vtable_conflict *)0x0) {
    __n = strlen((char *)__s);
    memset(__s,0,__n);
    free(paVar1[2].vtable);
    paVar1[2].vtable = (archive_vtable_conflict *)0x0;
  }
  return iVar3;
}

Assistant:

static int
archive_write_client_close(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state = (struct archive_none *)f->data;
	ssize_t block_length;
	ssize_t target_block_length;
	ssize_t bytes_written;
	int ret = ARCHIVE_OK;

	/* If there's pending data, pad and write the last block */
	if (state->next != state->buffer) {
		block_length = state->buffer_size - state->avail;

		/* Tricky calculation to determine size of last block */
		if (a->bytes_in_last_block <= 0)
			/* Default or Zero: pad to full block */
			target_block_length = a->bytes_per_block;
		else
			/* Round to next multiple of bytes_in_last_block. */
			target_block_length = a->bytes_in_last_block *
			    ( (block_length + a->bytes_in_last_block - 1) /
			        a->bytes_in_last_block);
		if (target_block_length > a->bytes_per_block)
			target_block_length = a->bytes_per_block;
		if (block_length < target_block_length) {
			memset(state->next, 0,
			    target_block_length - block_length);
			block_length = target_block_length;
		}
		bytes_written = (a->client_writer)(&a->archive,
		    a->client_data, state->buffer, block_length);
		ret = bytes_written <= 0 ? ARCHIVE_FATAL : ARCHIVE_OK;
	}
	if (a->client_closer)
		(*a->client_closer)(&a->archive, a->client_data);
	free(state->buffer);
	free(state);
	/* Clear the close handler myself not to be called again. */
	f->close = NULL;
	a->client_data = NULL;
	/* Clear passphrase. */
	if (a->passphrase != NULL) {
		memset(a->passphrase, 0, strlen(a->passphrase));
		free(a->passphrase);
		a->passphrase = NULL;
	}
	return (ret);
}